

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitstream.cpp
# Opt level: O3

ConstantValue *
slang::ast::Bitstream::resizeToRange
          (ConstantValue *__return_storage_ptr__,ConstantValue *value,ConstantRange range,
          ConstantValue *defaultValue,bool keepArray)

{
  __index_type _Var1;
  pointer pCVar2;
  SVQueue *pSVar3;
  _Elt_pointer pCVar4;
  int32_t diff;
  int iVar5;
  uint uVar6;
  size_t sVar7;
  _Copy_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  *__rhs;
  variant_alternative_t<5UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *pvVar8;
  variant_alternative_t<8UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *pvVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  int32_t diff_1;
  int iVar13;
  _Move_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  *__rhs_00;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  uint uVar18;
  _Self __tmp;
  _Self __tmp_1;
  Elements sliceValue;
  _Deque_iterator<slang::ConstantValue,_const_slang::ConstantValue_&,_const_slang::ConstantValue_*>
  local_118;
  _Deque_iterator<slang::ConstantValue,_const_slang::ConstantValue_&,_const_slang::ConstantValue_*>
  local_f8;
  SVQueue local_d8;
  iterator local_78;
  const_iterator local_58;
  
  uVar6 = range.left;
  uVar15 = range.right;
  iVar5 = uVar6 - uVar15;
  if (iVar5 == 0 && !keepArray) {
    sVar7 = ConstantValue::size(value);
    __rhs_00 = (_Move_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                *)defaultValue;
    if ((ulong)(long)(int)uVar6 < sVar7) {
      __rhs = (_Copy_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               *)ConstantValue::at(value,(long)(int)uVar6);
      std::__detail::__variant::
      _Copy_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      ::_Copy_ctor_base((_Copy_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                         *)__return_storage_ptr__,__rhs);
      return __return_storage_ptr__;
    }
LAB_0022044e:
    std::__detail::__variant::
    _Move_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
    ::_Move_ctor_base((_Move_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                       *)__return_storage_ptr__,__rhs_00);
    return __return_storage_ptr__;
  }
  uVar18 = uVar6;
  if ((int)uVar15 < (int)uVar6) {
    uVar18 = uVar15;
  }
  if ((int)uVar18 < 1) {
    iVar13 = -iVar5;
    if (0 < iVar5) {
      iVar13 = iVar5;
    }
    sVar7 = ConstantValue::size(value);
    __rhs_00 = (_Move_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                *)value;
    if (sVar7 == iVar13 + 1) goto LAB_0022044e;
  }
  iVar5 = uVar6 - uVar15;
  if (iVar5 != 0 && (int)uVar15 <= (int)uVar6) {
    uVar15 = uVar6;
  }
  sVar7 = ConstantValue::size(value);
  uVar16 = uVar15 + 1;
  uVar6 = (uint)sVar7;
  uVar17 = (ulong)uVar16;
  if (uVar6 <= uVar16) {
    uVar17 = sVar7 & 0xffffffff;
  }
  uVar11 = 0;
  if (uVar6 <= uVar15) {
    uVar11 = uVar16 - uVar6;
  }
  _Var1 = *(__index_type *)
           ((long)&(value->value).
                   super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                   .
                   super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                   .
                   super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                   .
                   super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                   .
                   super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                   .
                   super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
           + 0x20);
  if (_Var1 != '\b') {
    if (_Var1 != '\x05') {
      assert::assertFailed
                ("value.isQueue()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/Bitstream.cpp"
                 ,0x357,
                 "static ConstantValue slang::ast::Bitstream::resizeToRange(ConstantValue &&, ConstantRange, ConstantValue, bool)"
                );
    }
    pvVar8 = std::
             get<5ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                       (&value->value);
    pCVar2 = (pvVar8->
             super__Vector_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>).
             _M_impl.super__Vector_impl_data._M_start;
    local_d8.super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
    super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>._M_impl.
    super__Deque_impl_data._M_map = (_Map_pointer)0x0;
    local_d8.super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
    super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>._M_impl.
    super__Deque_impl_data._M_map_size = 0;
    local_d8.super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
    super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>._M_impl.
    super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
    iVar13 = -iVar5;
    if (0 < iVar5) {
      iVar13 = iVar5;
    }
    std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::reserve
              ((vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)&local_d8,
               (ulong)(iVar13 + 1));
    std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>::
    _M_range_insert<slang::ConstantValue_const*>
              ((vector<slang::ConstantValue,std::allocator<slang::ConstantValue>> *)&local_d8,
               local_d8.super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
               super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
               _M_impl.super__Deque_impl_data._M_map_size,pCVar2 + uVar18,pCVar2 + uVar17);
    std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::_M_fill_insert
              ((vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)&local_d8,
               (iterator)
               local_d8.super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
               super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
               _M_impl.super__Deque_impl_data._M_map_size,(ulong)uVar11,defaultValue);
    if (((long)(local_d8.super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
                super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
                _M_impl.super__Deque_impl_data._M_map_size -
               (long)local_d8.
                     super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
                     super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
                     _M_impl.super__Deque_impl_data._M_map) >> 3) * -0x3333333333333333 -
        (ulong)(iVar13 + 1) == 0) {
      *(_Map_pointer *)
       &(__return_storage_ptr__->value).
        super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        .
        super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        .
        super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        .
        super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        .
        super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        .
        super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
           = local_d8.super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
             super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>._M_impl.
             super__Deque_impl_data._M_map;
      *(size_t *)
       ((long)&(__return_storage_ptr__->value).
               super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
       + 8) = local_d8.super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
              super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>._M_impl
              .super__Deque_impl_data._M_map_size;
      *(_Elt_pointer *)
       ((long)&(__return_storage_ptr__->value).
               super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
       + 0x10) = local_d8.super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
                 super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
                 _M_impl.super__Deque_impl_data._M_start._M_cur;
      local_d8.super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
      super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>._M_impl.
      super__Deque_impl_data._M_map = (_Map_pointer)0x0;
      local_d8.super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
      super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>._M_impl.
      super__Deque_impl_data._M_map_size = 0;
      local_d8.super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
      super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>._M_impl.
      super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->value).
               super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               .
               super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
       + 0x20) = '\x05';
      std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::~vector
                ((vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)&local_d8);
      return __return_storage_ptr__;
    }
    assert::assertFailed
              ("sliceValue.size() == range.width()",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/Bitstream.cpp"
               ,0x353,
               "static ConstantValue slang::ast::Bitstream::resizeToRange(ConstantValue &&, ConstantRange, ConstantValue, bool)"
              );
  }
  pvVar9 = std::
           get<8ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                     (&value->value);
  pSVar3 = pvVar9->ptr;
  local_f8._M_cur =
       (pSVar3->super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>).
       super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>._M_impl.
       super__Deque_impl_data._M_start._M_cur;
  local_f8._M_first =
       (pSVar3->super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>).
       super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>._M_impl.
       super__Deque_impl_data._M_start._M_first;
  local_f8._M_last =
       (pSVar3->super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>).
       super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>._M_impl.
       super__Deque_impl_data._M_start._M_last;
  local_f8._M_node =
       (pSVar3->super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>).
       super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>._M_impl.
       super__Deque_impl_data._M_start._M_node;
  lVar10 = ((long)local_f8._M_cur - (long)local_f8._M_first >> 3) * -0x3333333333333333;
  uVar14 = lVar10 + (ulong)uVar18;
  if ((long)uVar14 < 0) {
    uVar12 = ~(~uVar14 / 0xc);
LAB_002204e5:
    local_118._M_node = local_f8._M_node + uVar12;
    local_118._M_first = *local_118._M_node;
    local_118._M_last = local_118._M_first + 0xc;
    local_118._M_cur = local_118._M_first + uVar12 * -0xc + uVar14;
  }
  else {
    if (0xb < uVar14) {
      uVar12 = uVar14 / 0xc;
      goto LAB_002204e5;
    }
    local_118._M_cur = local_f8._M_cur + uVar18;
    local_118._M_first = local_f8._M_first;
    local_118._M_last = local_f8._M_last;
    local_118._M_node = local_f8._M_node;
  }
  uVar14 = lVar10 + uVar17;
  if ((long)uVar14 < 0) {
    uVar17 = ~(~uVar14 / 0xc);
  }
  else {
    if (uVar14 < 0xc) {
      local_f8._M_cur = local_f8._M_cur + uVar17;
      goto LAB_0022059f;
    }
    uVar17 = uVar14 / 0xc;
  }
  local_f8._M_node = local_f8._M_node + uVar17;
  local_f8._M_first = *local_f8._M_node;
  local_f8._M_last = local_f8._M_first + 0xc;
  local_f8._M_cur = local_f8._M_first + uVar17 * -0xc + uVar14;
LAB_0022059f:
  std::deque<slang::ConstantValue,std::allocator<slang::ConstantValue>>::
  deque<std::_Deque_iterator<slang::ConstantValue,slang::ConstantValue_const&,slang::ConstantValue_const*>,void>
            ((deque<slang::ConstantValue,std::allocator<slang::ConstantValue>> *)&local_d8,
             &local_118,&local_f8,(allocator_type *)&local_78);
  local_d8.maxBound = 0;
  local_58._M_cur =
       local_d8.super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
       super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>._M_impl.
       super__Deque_impl_data._M_finish._M_cur;
  local_58._M_first =
       local_d8.super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
       super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>._M_impl.
       super__Deque_impl_data._M_finish._M_first;
  local_58._M_last =
       local_d8.super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
       super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>._M_impl.
       super__Deque_impl_data._M_finish._M_last;
  local_58._M_node =
       local_d8.super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
       super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>._M_impl.
       super__Deque_impl_data._M_finish._M_node;
  std::deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::insert
            (&local_78,
             &local_d8.super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,
             &local_58,(ulong)uVar11,defaultValue);
  iVar13 = -iVar5;
  if (0 < iVar5) {
    iVar13 = iVar5;
  }
  if (((long)local_d8.super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
             super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>._M_impl.
             super__Deque_impl_data._M_start._M_last -
       (long)local_d8.super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
             super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>._M_impl.
             super__Deque_impl_data._M_start._M_cur >> 3) * -0x3333333333333333 +
      ((long)local_d8.super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
             super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur -
       (long)local_d8.super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
             super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>._M_impl.
             super__Deque_impl_data._M_finish._M_first >> 3) * -0x3333333333333333 +
      (((long)local_d8.super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
              super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>._M_impl
              .super__Deque_impl_data._M_finish._M_node -
        (long)local_d8.super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
              super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>._M_impl
              .super__Deque_impl_data._M_start._M_node >> 3) + -1 +
      (ulong)(local_d8.super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
              super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>._M_impl
              .super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)) * 0xc ==
      (ulong)(iVar13 + 1)) {
    CopyPtr<slang::SVQueue>::CopyPtr<slang::SVQueue,void>
              ((CopyPtr<slang::SVQueue> *)&local_78,&local_d8);
    pCVar4 = local_78._M_cur;
    local_78._M_cur = (_Elt_pointer)0x0;
    *(_Elt_pointer *)
     &(__return_storage_ptr__->value).
      super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      .
      super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      .
      super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      .
      super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      .
      super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      .
      super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
         = pCVar4;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->value).
             super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
     + 0x20) = '\b';
    CopyPtr<slang::SVQueue>::~CopyPtr((CopyPtr<slang::SVQueue> *)&local_78);
    std::deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::~deque
              (&local_d8.super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>);
    return __return_storage_ptr__;
  }
  assert::assertFailed
            ("sliceValue.size() == range.width()",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/Bitstream.cpp"
             ,0x35b,
             "static ConstantValue slang::ast::Bitstream::resizeToRange(ConstantValue &&, ConstantRange, ConstantValue, bool)"
            );
}

Assistant:

ConstantValue Bitstream::resizeToRange(ConstantValue&& value, ConstantRange range,
                                       ConstantValue defaultValue, bool keepArray) {
    if (range.left == range.right && !keepArray) {
        if (size_t(range.left) >= value.size())
            return defaultValue;
        else
            return std::move(value).at(size_t(range.left));
    }

    if (range.lower() > 0 || range.width() != value.size()) {
        auto upper = static_cast<uint32_t>(range.upper());
        auto lower = static_cast<uint32_t>(range.lower());
        auto size = static_cast<uint32_t>(value.size());
        auto more = upper >= size ? upper - size + 1 : 0;
        upper = std::min(upper + 1, size);

        if (value.isUnpacked()) {
            const auto old = value.elements();
            ConstantValue::Elements sliceValue;
            sliceValue.reserve(range.width());
            sliceValue.insert(sliceValue.end(), old.cbegin() + lower, old.cbegin() + upper);
            sliceValue.insert(sliceValue.end(), more, defaultValue);
            ASSERT(sliceValue.size() == range.width());
            return sliceValue;
        }
        else {
            ASSERT(value.isQueue());
            const auto& old = value.queue();
            SVQueue sliceValue(old->cbegin() + lower, old->cbegin() + upper);
            sliceValue.insert(sliceValue.end(), more, defaultValue);
            ASSERT(sliceValue.size() == range.width());
            return sliceValue;
        }
    }

    return std::move(value);
}